

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

bool DeploymentActiveAfter<Consensus::BuriedDeployment>
               (CBlockIndex *pindexPrev,ChainstateManager *chainman,BuriedDeployment dep)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = DeploymentActiveAfter
                      (pindexPrev,&((chainman->m_options).chainparams)->consensus,dep,
                       &chainman->m_versionbitscache);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentActiveAfter(const CBlockIndex* pindexPrev, const ChainstateManager& chainman, DEP dep)
{
    return DeploymentActiveAfter(pindexPrev, chainman.GetConsensus(), dep, chainman.m_versionbitscache);
}